

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_wad.cpp
# Opt level: O0

void __thiscall FileReaderLZSS::FileReaderLZSS(FileReaderLZSS *this,FileReader *file)

{
  BYTE *pBVar1;
  FileReader *file_local;
  FileReaderLZSS *this_local;
  
  FileReaderBase::FileReaderBase(&this->super_FileReaderBase);
  (this->super_FileReaderBase)._vptr_FileReaderBase = (_func_int **)&PTR__FileReaderLZSS_00b870d0;
  this->File = file;
  this->SawEOF = false;
  (this->Stream).State = STREAM_EMPTY;
  pBVar1 = (this->Stream).Window + 0x1000;
  (this->Stream).InternalBuffer = pBVar1;
  (this->Stream).WindowData = pBVar1;
  (this->Stream).InternalOut = 0;
  (this->Stream).AvailIn = 0;
  FillBuffer(this);
  return;
}

Assistant:

FileReaderLZSS(FileReader &file) : File(file), SawEOF(false)
	{
		Stream.State = STREAM_EMPTY;
		Stream.WindowData = Stream.InternalBuffer = Stream.Window+WINDOW_SIZE;
		Stream.InternalOut = 0;
		Stream.AvailIn = 0;

		FillBuffer();
	}